

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O3

int math_random(lua_State *L)

{
  int iVar1;
  lua_Number n;
  lua_Number lVar2;
  double dVar3;
  lua_Number lVar4;
  
  iVar1 = rand();
  n = (double)(iVar1 + ((int)((long)iVar1 * 0x40000001 >> 0x3d) - (iVar1 >> 0x1f)) * -0x7fffffff) /
      2147483647.0;
  iVar1 = lua_gettop(L);
  if (iVar1 == 2) {
    lVar2 = luaL_checknumber(L,1);
    lVar4 = luaL_checknumber(L,2);
    if (lVar4 < lVar2) {
      luaL_argerror(L,2,"interval is empty");
    }
    dVar3 = floor(n * ((lVar4 - lVar2) + 1.0));
    n = dVar3 + lVar2;
  }
  else if (iVar1 == 1) {
    lVar2 = luaL_checknumber(L,1);
    if (lVar2 < 1.0) {
      luaL_argerror(L,1,"interval is empty");
    }
    dVar3 = floor(n * lVar2);
    n = dVar3 + 1.0;
  }
  else if (iVar1 != 0) {
    iVar1 = luaL_error(L,"wrong number of arguments");
    return iVar1;
  }
  lua_pushnumber(L,n);
  return 1;
}

Assistant:

static int math_random (lua_State *L) {
  /* the `%' avoids the (rare) case of r==1, and is needed also because on
     some systems (SunOS!) `rand()' may return a value larger than RAND_MAX */
  lua_Number r = (lua_Number)(rand()%RAND_MAX) / (lua_Number)RAND_MAX;
  switch (lua_gettop(L)) {  /* check number of arguments */
    case 0: {  /* no arguments */
      lua_pushnumber(L, r);  /* Number between 0 and 1 */
      break;
    }
    case 1: {  /* only upper limit */
      lua_Number u = luaL_checknumber(L, 1);
      luaL_argcheck(L, (lua_Number)1.0 <= u, 1, "interval is empty");
      lua_pushnumber(L, l_mathop(floor)(r*u) + (lua_Number)(1.0));  /* [1, u] */
      break;
    }
    case 2: {  /* lower and upper limits */
      lua_Number l = luaL_checknumber(L, 1);
      lua_Number u = luaL_checknumber(L, 2);
      luaL_argcheck(L, l <= u, 2, "interval is empty");
      lua_pushnumber(L, l_mathop(floor)(r*(u-l+1)) + l);  /* [l, u] */
      break;
    }
    default: return luaL_error(L, "wrong number of arguments");
  }
  return 1;
}